

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example1.cpp
# Opt level: O0

void __thiscall Example::initializeUniverse(Example *this)

{
  S_Superellipsoid *pSVar1;
  S_Box *pSVar2;
  S_Sphere *pSVar3;
  allocator<char> local_391;
  value_type local_390;
  allocator<char> local_369;
  value_type local_368;
  allocator<char> local_341;
  value_type local_340;
  allocator<char> local_319;
  value_type local_318;
  allocator<char> local_2f1;
  value_type local_2f0;
  allocator<char> local_2c9;
  value_type local_2c8;
  allocator<char> local_2a1;
  value_type local_2a0;
  allocator<char> local_279;
  value_type local_278;
  allocator<char> local_251;
  value_type local_250;
  undefined8 local_230;
  double local_228;
  double local_220 [53];
  S_Sphere *local_78;
  S_Sphere *sphere3;
  S_Sphere *local_68;
  S_Sphere *sphere2;
  S_Sphere *local_58;
  S_Sphere *sphere1;
  S_Box *box3;
  S_Box *box2;
  S_Box *box1;
  S_Superellipsoid *super3;
  S_Superellipsoid *super2;
  S_Superellipsoid *local_18;
  S_Superellipsoid *super1;
  Example *this_local;
  
  super1 = (S_Superellipsoid *)this;
  pSVar1 = (S_Superellipsoid *)operator_new(0xd8);
  sch::S_Superellipsoid::S_Superellipsoid(pSVar1,1.0,0.2,0.5,0.3,0.1);
  local_18 = pSVar1;
  pSVar1 = (S_Superellipsoid *)operator_new(0xd8);
  sch::S_Superellipsoid::S_Superellipsoid(pSVar1,0.1,0.9,0.3,0.5,0.8);
  super3 = pSVar1;
  pSVar1 = (S_Superellipsoid *)operator_new(0xd8);
  sch::S_Superellipsoid::S_Superellipsoid(pSVar1,0.4,0.4,1.7,0.8,0.1);
  box1 = (S_Box *)pSVar1;
  pSVar2 = (S_Box *)operator_new(0xa8);
  sch::S_Box::S_Box(pSVar2,0.2,0.1,0.4);
  box2 = pSVar2;
  pSVar2 = (S_Box *)operator_new(0xa8);
  sch::S_Box::S_Box(pSVar2,2.1,1.1,0.8);
  box3 = pSVar2;
  pSVar2 = (S_Box *)operator_new(0xa8);
  sch::S_Box::S_Box(pSVar2,1.4,4.1,1.2);
  sphere1 = (S_Sphere *)pSVar2;
  pSVar3 = (S_Sphere *)operator_new(0x98);
  sphere2 = (S_Sphere *)0x3fd3333333333333;
  sch::S_Sphere::S_Sphere(pSVar3,(double *)&sphere2);
  local_58 = pSVar3;
  pSVar3 = (S_Sphere *)operator_new(0x98);
  sphere3 = (S_Sphere *)0x3fe0000000000000;
  sch::S_Sphere::S_Sphere(pSVar3,(double *)&sphere3);
  local_68 = pSVar3;
  pSVar3 = (S_Sphere *)operator_new(0x98);
  local_220[0x34] = 0.2;
  sch::S_Sphere::S_Sphere(pSVar3,local_220 + 0x34);
  local_220[0x33] = 1.0;
  local_220[0x32] = 0.2;
  local_220[0x31] = 0.5;
  local_78 = pSVar3;
  sch::S_Object::setPosition((double *)local_18,local_220 + 0x33,local_220 + 0x32);
  local_220[0x30] = -2.2;
  local_220[0x2f] = -1.1;
  local_220[0x2e] = 1.3;
  sch::S_Object::setPosition((double *)super3,local_220 + 0x30,local_220 + 0x2f);
  local_220[0x2d] = 0.4;
  local_220[0x2c] = 0.4;
  local_220[0x2b] = -1.7;
  sch::S_Object::setPosition((double *)box1,local_220 + 0x2d,local_220 + 0x2c);
  local_220[0x2a] = -0.2;
  local_220[0x29] = 0.1;
  local_220[0x28] = -0.4;
  sch::S_Object::setPosition((double *)box2,local_220 + 0x2a,local_220 + 0x29);
  local_220[0x27] = -2.1;
  local_220[0x26] = -1.1;
  local_220[0x25] = 0.8;
  sch::S_Object::setPosition((double *)box3,local_220 + 0x27,local_220 + 0x26);
  local_220[0x24] = -2.0;
  local_220[0x23] = -1.0;
  local_220[0x22] = 1.2;
  sch::S_Object::setPosition((double *)sphere1,local_220 + 0x24,local_220 + 0x23);
  local_220[0x21] = -2.1;
  local_220[0x20] = 1.1;
  local_220[0x1f] = 0.8;
  sch::S_Object::setPosition((double *)local_58,local_220 + 0x21,local_220 + 0x20);
  local_220[0x1e] = 2.1;
  local_220[0x1d] = 1.1;
  local_220[0x1c] = -0.4;
  sch::S_Object::setPosition((double *)local_68,local_220 + 0x1e,local_220 + 0x1d);
  local_220[0x1b] = 2.3;
  local_220[0x1a] = 1.1;
  local_220[0x19] = -0.5;
  sch::S_Object::setPosition((double *)local_78,local_220 + 0x1b,local_220 + 0x1a);
  local_220[0x18] = -2.1;
  local_220[0x17] = 1.1;
  local_220[0x16] = 0.8;
  sch::S_Object::setOrientation((double *)local_18,local_220 + 0x18,local_220 + 0x17);
  local_220[0x15] = 2.1;
  local_220[0x14] = 1.1;
  local_220[0x13] = -0.4;
  sch::S_Object::setOrientation((double *)super3,local_220 + 0x15,local_220 + 0x14);
  local_220[0x12] = 2.1;
  local_220[0x11] = 1.1;
  local_220[0x10] = -0.5;
  sch::S_Object::setOrientation((double *)box1,local_220 + 0x12,local_220 + 0x11);
  local_220[0xf] = -0.2;
  local_220[0xe] = 0.1;
  local_220[0xd] = -0.4;
  sch::S_Object::setOrientation((double *)box2,local_220 + 0xf,local_220 + 0xe);
  local_220[0xc] = -2.1;
  local_220[0xb] = -1.1;
  local_220[10] = 0.8;
  sch::S_Object::setOrientation((double *)box3,local_220 + 0xc,local_220 + 0xb);
  local_220[9] = -2.0;
  local_220[8] = -1.0;
  local_220[7] = 1.2;
  sch::S_Object::setOrientation((double *)sphere1,local_220 + 9,local_220 + 8);
  local_220[6] = 1.0;
  local_220[5] = 0.2;
  local_220[4] = 0.5;
  sch::S_Object::setOrientation((double *)local_58,local_220 + 6,local_220 + 5);
  local_220[3] = -2.2;
  local_220[2] = -1.1;
  local_220[1] = 1.3;
  sch::S_Object::setOrientation((double *)local_68,local_220 + 3,local_220 + 2);
  local_220[0] = 0.4;
  local_228 = 0.4;
  local_230 = 0xbffb333333333333;
  sch::S_Object::setOrientation((double *)local_78,local_220,&local_228);
  sch::CD_Scene::addObject((S_Object *)this);
  sch::CD_Scene::addObject((S_Object *)this);
  sch::CD_Scene::addObject((S_Object *)this);
  sch::CD_Scene::addObject((S_Object *)this);
  sch::CD_Scene::addObject((S_Object *)this);
  sch::CD_Scene::addObject((S_Object *)this);
  sch::CD_Scene::addObject((S_Object *)this);
  sch::CD_Scene::addObject((S_Object *)this);
  sch::CD_Scene::addObject((S_Object *)this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,"super1",&local_251);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->objName,&local_250);
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator(&local_251);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_278,"super2",&local_279);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->objName,&local_278);
  std::__cxx11::string::~string((string *)&local_278);
  std::allocator<char>::~allocator(&local_279);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,"super3",&local_2a1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->objName,&local_2a0);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator(&local_2a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c8,"box1",&local_2c9);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->objName,&local_2c8);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::allocator<char>::~allocator(&local_2c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f0,"box2",&local_2f1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->objName,&local_2f0);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::allocator<char>::~allocator(&local_2f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_318,"box3",&local_319);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->objName,&local_318);
  std::__cxx11::string::~string((string *)&local_318);
  std::allocator<char>::~allocator(&local_319);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_340,"sphere1",&local_341);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->objName,&local_340);
  std::__cxx11::string::~string((string *)&local_340);
  std::allocator<char>::~allocator(&local_341);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_368,"sphere2",&local_369);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->objName,&local_368);
  std::__cxx11::string::~string((string *)&local_368);
  std::allocator<char>::~allocator(&local_369);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_390,"sphere3",&local_391);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->objName,&local_390);
  std::__cxx11::string::~string((string *)&local_390);
  std::allocator<char>::~allocator(&local_391);
  return;
}

Assistant:

void Example::initializeUniverse()
{
  //Objects initializations
  S_Superellipsoid * super1 = new S_Superellipsoid (1.0,0.2,0.5,0.3,0.1);
  S_Superellipsoid * super2 = new S_Superellipsoid (0.1,0.9,0.3,0.5,0.8);
  S_Superellipsoid * super3 = new S_Superellipsoid (0.4,0.4,1.7,0.8,0.1);
  S_Box * box1 = new S_Box (0.2,0.1,0.4);
  S_Box * box2 = new S_Box (2.1,1.1,0.8);
  S_Box * box3 = new S_Box (1.4,4.1,1.2);
  S_Sphere * sphere1 = new S_Sphere (0.3);
  S_Sphere * sphere2 = new S_Sphere (0.5);
  S_Sphere * sphere3 = new S_Sphere (0.2);

  //Positions/Orientations
  super1->setPosition(1.0,0.2,0.5);
  super2->setPosition(-2.2,-1.1,1.3);
  super3->setPosition(0.4,0.4,-1.7);
  box1->setPosition(-0.2,0.1,-0.4);
  box2->setPosition(-2.1,-1.1,0.8);
  box3->setPosition(-2.0,-1.0,1.2);
  sphere1->setPosition(-2.1,1.1,0.8);
  sphere2->setPosition(2.1,1.1,-0.4);
  sphere3->setPosition(2.3,1.1,-0.5);

  super1-> setOrientation(-2.1,1.1,0.8);
  super2-> setOrientation(2.1,1.1,-0.4);
  super3-> setOrientation(2.1,1.1,-0.5);
  box1->   setOrientation(-0.2,0.1,-0.4);
  box2->   setOrientation(-2.1,-1.1,0.8);
  box3->   setOrientation(-2.0,-1.0,1.2);
  sphere1->setOrientation(1.0,0.2,0.5);
  sphere2->setOrientation(-2.2,-1.1,1.3);
  sphere3->setOrientation(0.4,0.4,-1.7);


  //This makes 36 pairs. We can use the scene manager to simplify pairs
  //allocation.

  //Scene manager
  // This is a minimal implementation of a scene manager. It stores
  // pointers and generates automatically collision detection pairs.
  // The library can be used without this scene manager.

  //Adding objects to the manager is simple As fo pairs, the scene does not
  //copy the objects and requires only addresses of the objects. The user
  //creates and destroys the objects separately.
  sObj.addObject(super1);
  sObj.addObject(super2);
  sObj.addObject(super3);
  sObj.addObject(box1);
  sObj.addObject(box2);
  sObj.addObject(box3);
  sObj.addObject(sphere1);
  sObj.addObject(sphere2);
  sObj.addObject(sphere3);

  objName.push_back("super1");
  objName.push_back("super2");
  objName.push_back("super3");
  objName.push_back("box1");
  objName.push_back("box2");
  objName.push_back("box3");
  objName.push_back("sphere1");
  objName.push_back("sphere2");
  objName.push_back("sphere3");
}